

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::status_internal::StatusRep::operator==(StatusRep *this,StatusRep *other)

{
  size_t sVar1;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar2;
  ulong uVar3;
  Storage<unsigned_long,_1UL,_false> SVar4;
  Cord *this_00;
  bool bVar5;
  int iVar6;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar7;
  ulong uVar8;
  ulong uVar9;
  size_t size_to_compare;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar10;
  Payload *payload;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar11;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar12;
  ulong uVar13;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar14;
  long lVar15;
  byte bVar16;
  byte bVar17;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar18;
  Cord *rhs;
  byte bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  Payloads no_payloads;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  local_68;
  
  if (this == other) {
    __assert_fail("this != &other",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/status/internal/status_internal.cc"
                  ,0x9e,"bool absl::status_internal::StatusRep::operator==(const StatusRep &) const"
                 );
  }
  if (((this->code_ == other->code_) &&
      (sVar1 = (this->message_)._M_string_length, sVar1 == (other->message_)._M_string_length)) &&
     ((sVar1 == 0 ||
      (iVar6 = bcmp((this->message_)._M_dataplus._M_p,(other->message_)._M_dataplus._M_p,sVar1),
      iVar6 == 0)))) {
    pSVar7 = &((this->payloads_)._M_t.
               super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
               .
               super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
              ._M_head_impl)->storage_;
    pSVar2 = &((other->payloads_)._M_t.
               super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
               .
               super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
              ._M_head_impl)->storage_;
    if (pSVar7 == (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                   *)0x0) {
      pSVar7 = &local_68;
    }
    pSVar10 = pSVar2;
    if (pSVar2 == (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                   *)0x0) {
      pSVar10 = &local_68;
    }
    local_68.metadata_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value =
         (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          )(Storage<unsigned_long,_1UL,_false>)0x0;
    uVar9 = (pSVar7->metadata_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<unsigned_long,_1UL,_false>.value;
    uVar8 = uVar9 >> 1;
    uVar3 = (pSVar10->metadata_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<unsigned_long,_1UL,_false>.value;
    uVar13 = uVar3 >> 1;
    if (uVar8 < uVar13) {
      uVar9 = uVar3;
      pSVar10 = pSVar7;
    }
    if ((uVar9 >> 1) -
        ((pSVar10->metadata_).
         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
         .super_Storage<unsigned_long,_1UL,_false>.value >> 1) < 2) {
      pSVar11 = pSVar2;
      if (pSVar2 == (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                     *)0x0) {
        pSVar11 = &local_68;
      }
      if (uVar13 <= uVar8) {
        pSVar11 = pSVar7;
      }
      if ((uVar9 & 1) == 0) {
        pPVar12 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
                  &pSVar11->data_;
      }
      else {
        pPVar12 = (pSVar11->data_).allocated.allocated_data;
      }
      bVar20 = uVar9 < 2;
      if (!bVar20) {
        pPVar14 = pPVar12 + (uVar9 >> 1);
        pSVar11 = &local_68;
        if (pSVar2 != (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                       *)0x0) {
          pSVar11 = pSVar2;
        }
        if (uVar8 < uVar13) {
          pSVar11 = pSVar7;
        }
        do {
          SVar4.value = (pSVar10->metadata_).
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                        .super_Storage<unsigned_long,_1UL,_false>.value;
          pPVar18 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
                    &pSVar11->data_;
          if ((SVar4.value & 1) != 0) {
            pPVar18 = (pSVar11->data_).allocated.allocated_data;
          }
          if (SVar4.value < 2) {
            bVar19 = 4;
            bVar17 = 1;
          }
          else {
            this_00 = &pPVar12->payload;
            lVar15 = (SVar4.value >> 1) * 0x30;
            rhs = &pPVar18->payload;
            bVar17 = 0;
            bVar16 = 0;
            do {
              sVar1 = (pPVar12->type_url)._M_string_length;
              bVar19 = 0;
              bVar21 = false;
              if (sVar1 == (((Payload *)(rhs + -2))->type_url)._M_string_length) {
                if (sVar1 == 0) {
                  bVar21 = true;
                }
                else {
                  iVar6 = bcmp((pPVar12->type_url)._M_dataplus._M_p,
                               (((Payload *)(rhs + -2))->type_url)._M_dataplus._M_p,sVar1);
                  bVar21 = iVar6 == 0;
                }
              }
              if (bVar21) {
                auVar22[0] = -((rhs->contents_).data_.rep_.field_0.data[0] ==
                              (this_00->contents_).data_.rep_.field_0.data[0]);
                auVar22[1] = -((rhs->contents_).data_.rep_.field_0.data[1] ==
                              (pPVar12->payload).contents_.data_.rep_.field_0.data[1]);
                auVar22[2] = -((rhs->contents_).data_.rep_.field_0.data[2] ==
                              (pPVar12->payload).contents_.data_.rep_.field_0.data[2]);
                auVar22[3] = -((rhs->contents_).data_.rep_.field_0.data[3] ==
                              (pPVar12->payload).contents_.data_.rep_.field_0.data[3]);
                auVar22[4] = -((rhs->contents_).data_.rep_.field_0.data[4] ==
                              (pPVar12->payload).contents_.data_.rep_.field_0.data[4]);
                auVar22[5] = -((rhs->contents_).data_.rep_.field_0.data[5] ==
                              (pPVar12->payload).contents_.data_.rep_.field_0.data[5]);
                auVar22[6] = -((rhs->contents_).data_.rep_.field_0.data[6] ==
                              (pPVar12->payload).contents_.data_.rep_.field_0.data[6]);
                auVar22[7] = -((rhs->contents_).data_.rep_.field_0.data[7] ==
                              (pPVar12->payload).contents_.data_.rep_.field_0.data[7]);
                auVar22[8] = -((rhs->contents_).data_.rep_.field_0.data[8] ==
                              (pPVar12->payload).contents_.data_.rep_.field_0.data[8]);
                auVar22[9] = -((rhs->contents_).data_.rep_.field_0.data[9] ==
                              (pPVar12->payload).contents_.data_.rep_.field_0.data[9]);
                auVar22[10] = -((rhs->contents_).data_.rep_.field_0.data[10] ==
                               (pPVar12->payload).contents_.data_.rep_.field_0.data[10]);
                auVar22[0xb] = -((rhs->contents_).data_.rep_.field_0.data[0xb] ==
                                (pPVar12->payload).contents_.data_.rep_.field_0.data[0xb]);
                auVar22[0xc] = -((rhs->contents_).data_.rep_.field_0.data[0xc] ==
                                (pPVar12->payload).contents_.data_.rep_.field_0.data[0xc]);
                auVar22[0xd] = -((rhs->contents_).data_.rep_.field_0.data[0xd] ==
                                (pPVar12->payload).contents_.data_.rep_.field_0.data[0xd]);
                auVar22[0xe] = -((rhs->contents_).data_.rep_.field_0.data[0xe] ==
                                (pPVar12->payload).contents_.data_.rep_.field_0.data[0xe]);
                auVar22[0xf] = -((rhs->contents_).data_.rep_.field_0.data[0xf] ==
                                (pPVar12->payload).contents_.data_.rep_.field_0.data[0xf]);
                if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar22[0xf] >> 7) << 0xf) == 0xffff) {
                  bVar5 = false;
                }
                else {
                  uVar9 = (ulong)(rhs->contents_).data_.rep_.field_0.data[0];
                  if ((uVar9 & 1) == 0) {
                    size_to_compare = uVar9 >> 1;
                  }
                  else {
                    size_to_compare = ((rhs->contents_).data_.rep_.field_0.as_tree.rep)->length;
                  }
                  uVar9 = (ulong)(this_00->contents_).data_.rep_.field_0.data[0];
                  if ((uVar9 & 1) == 0) {
                    uVar9 = uVar9 >> 1;
                  }
                  else {
                    uVar9 = ((pPVar12->payload).contents_.data_.rep_.field_0.as_tree.rep)->length;
                  }
                  bVar5 = true;
                  if (uVar9 == size_to_compare) {
                    bVar5 = Cord::EqualsImpl(this_00,rhs,size_to_compare);
                    bVar5 = !bVar5;
                  }
                }
                bVar16 = bVar17;
                if (bVar5 == false) {
                  bVar16 = 1;
                }
                bVar19 = (bVar5 ^ 1U) * '\x03' + 1;
                bVar17 = bVar16;
              }
              if (bVar21) goto LAB_00325e79;
              rhs = rhs + 3;
              lVar15 = lVar15 + -0x30;
            } while (lVar15 != 0);
            bVar19 = 4;
LAB_00325e79:
            bVar17 = ~bVar16 & 1;
          }
          if (bVar19 != 4) {
            bVar17 = bVar19;
          }
          if (bVar17 != 0) break;
          pPVar12 = pPVar12 + 1;
          bVar20 = pPVar12 == pPVar14;
        } while (!bVar20);
      }
    }
    else {
      bVar20 = false;
    }
    inlined_vector_internal::
    Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
    ::~Storage(&local_68);
  }
  else {
    bVar20 = false;
  }
  return bVar20;
}

Assistant:

bool StatusRep::operator==(const StatusRep& other) const {
  assert(this != &other);
  if (code_ != other.code_) return false;
  if (message_ != other.message_) return false;
  const status_internal::Payloads* this_payloads = payloads_.get();
  const status_internal::Payloads* other_payloads = other.payloads_.get();

  const status_internal::Payloads no_payloads;
  const status_internal::Payloads* larger_payloads =
      this_payloads ? this_payloads : &no_payloads;
  const status_internal::Payloads* smaller_payloads =
      other_payloads ? other_payloads : &no_payloads;
  if (larger_payloads->size() < smaller_payloads->size()) {
    std::swap(larger_payloads, smaller_payloads);
  }
  if ((larger_payloads->size() - smaller_payloads->size()) > 1) return false;
  // Payloads can be ordered differently, so we can't just compare payload
  // vectors.
  for (const auto& payload : *larger_payloads) {

    bool found = false;
    for (const auto& other_payload : *smaller_payloads) {
      if (payload.type_url == other_payload.type_url) {
        if (payload.payload != other_payload.payload) {
          return false;
        }
        found = true;
        break;
      }
    }
    if (!found) return false;
  }
  return true;
}